

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O0

bool __thiscall BoxNesting::KuhnAlgorithm::kuhn(KuhnAlgorithm *this,int16_t vertex)

{
  short sVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  short in_SI;
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  *in_RDI;
  reference rVar7;
  value_type to;
  int16_t i;
  size_type sz;
  short local_42;
  _Bit_reference in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffe8;
  value_type vVar8;
  
  rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffc8._M_mask,
                     (size_type)in_stack_ffffffffffffffc8._M_p);
  bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffd8);
  if (!bVar2) {
    std::vector<bool,_std::allocator<bool>_>::operator[]
              ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffc8._M_mask,
               (size_type)in_stack_ffffffffffffffc8._M_p);
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffc8,true);
    pvVar3 = std::
             vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ::operator[](in_RDI,(long)in_SI);
    sVar4 = std::vector<short,_std::allocator<short>_>::size(pvVar3);
    for (local_42 = 0; (ulong)(long)local_42 < sVar4; local_42 = local_42 + 1) {
      pvVar3 = std::
               vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ::operator[](in_RDI,(long)in_SI);
      pvVar5 = std::vector<short,_std::allocator<short>_>::operator[](pvVar3,(long)local_42);
      sVar1 = *pvVar5;
      pvVar6 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)(in_RDI + 4),(long)sVar1);
      if (*pvVar6 == -1) {
LAB_00133e69:
        vVar8 = in_SI;
        pvVar6 = std::vector<short,_std::allocator<short>_>::operator[]
                           ((vector<short,_std::allocator<short>_> *)(in_RDI + 4),(long)sVar1);
        *pvVar6 = in_SI;
        pvVar6 = std::vector<short,_std::allocator<short>_>::operator[]
                           ((vector<short,_std::allocator<short>_> *)(in_RDI + 3),(long)vVar8);
        *pvVar6 = sVar1;
        return true;
      }
      std::vector<short,_std::allocator<short>_>::operator[]
                ((vector<short,_std::allocator<short>_> *)(in_RDI + 4),(long)sVar1);
      bVar2 = kuhn((KuhnAlgorithm *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),rVar7._M_mask._6_2_);
      if (bVar2) goto LAB_00133e69;
    }
  }
  return false;
}

Assistant:

bool KuhnAlgorithm::kuhn(int16_t vertex) const
{
	if (this->used[vertex]) {
		return false;
	}
	this->used[vertex] = true;

	auto sz = this->graph[vertex].size();
	for (int16_t i = 0; i < sz; ++i) {
		auto to = this->graph[vertex][i];
		if (this->pairsRight[to] == -1 || kuhn(this->pairsRight[to])) {
			this->pairsRight[to] = vertex;
			this->pairsLeft[vertex] = to;
			return true;
		}
	}
	return false;
}